

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kdasm.c
# Opt level: O3

char * get_ea_mode_str(uint instruction,uint size)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  char *pcVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  uint uVar10;
  undefined8 uVar11;
  ulong uVar12;
  uint uVar13;
  char cVar14;
  char base_reg [4];
  char index_reg [8];
  undefined2 local_48;
  undefined1 local_46;
  char local_44 [8];
  uint local_3c;
  uint local_38;
  uint local_34;
  
  pcVar6 = get_ea_mode_str::b2;
  if (get_ea_mode_str::mode != get_ea_mode_str::b1) {
    pcVar6 = get_ea_mode_str::b1;
  }
  uVar12 = (ulong)(instruction & 0x3f);
  get_ea_mode_str::mode = pcVar6;
  switch(uVar12) {
  case 0:
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    pcVar9 = "D%d";
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    pcVar9 = "A%d";
    break;
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
    pcVar9 = "(A%d)";
    break;
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
    pcVar9 = "(A%d)+";
    break;
  case 0x20:
  case 0x21:
  case 0x22:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
    pcVar9 = "-(A%d)";
    break;
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
    uVar3 = dasm_read_imm_16(instruction);
    make_signed_hex_str_16(uVar3);
    sprintf(pcVar6,"(%s,A%d)",make_signed_hex_str_16::str,(ulong)(instruction & 7));
    return get_ea_mode_str::mode;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
    uVar10 = instruction;
    uVar3 = dasm_read_imm_16(instruction);
    pcVar6 = get_ea_mode_str::mode;
    if ((uVar3 >> 8 & 1) == 0) {
      if ((char)uVar3 == '\0') {
        uVar11 = 0x6c;
        if ((uVar3 >> 0xb & 1) == 0) {
          uVar11 = 0x77;
        }
        sprintf(get_ea_mode_str::mode,"(A%d,%c%d.%c",(ulong)(instruction & 7),
                (ulong)((uint)(uVar3 < 0x8000) * 3 + 0x41),(ulong)(uVar3 >> 0xc & 7),uVar11);
      }
      else {
        make_signed_hex_str_8(uVar3);
        uVar5 = instruction & 7;
        uVar10 = (uint)(uVar3 < 0x8000) * 3 + 0x41;
        uVar12 = (ulong)(uVar3 >> 0xc & 7);
        pcVar9 = "(%s,A%d,%c%d.%c";
LAB_00400ef6:
        sprintf(pcVar6,pcVar9,make_signed_hex_str_8::str,(ulong)uVar5,(ulong)uVar10,uVar12);
      }
LAB_00400fa8:
      pcVar6 = get_ea_mode_str::mode;
      uVar3 = uVar3 >> 9 & 3;
      if (uVar3 != 0) {
        sVar4 = strlen(get_ea_mode_str::mode);
        sprintf(pcVar6 + sVar4,"*%d",(ulong)(uint)(1 << (sbyte)uVar3));
      }
      goto LAB_00401365;
    }
    if ((uVar3 & 0xe4) == 0xc4 || (uVar3 & 0xe2) == 0xc0) {
LAB_00400f26:
      pcVar6 = get_ea_mode_str::mode;
      pcVar6[0] = '0';
      pcVar6[1] = '\0';
      return get_ea_mode_str::mode;
    }
    uVar7 = uVar3 & 0x30;
    uVar13 = 0;
    uVar8 = 0;
    if (0x10 < uVar7) {
      if (uVar7 == 0x30) {
        uVar8 = dasm_read_imm_32(uVar10);
      }
      else {
        uVar8 = dasm_read_imm_16(uVar10);
      }
    }
    uVar5 = uVar3 & 3;
    local_3c = uVar3 & 0x44;
    if (local_3c != 0x44 && 1 < uVar5) {
      if (uVar5 == 3) {
        uVar13 = dasm_read_imm_32(uVar10);
      }
      else {
        uVar13 = dasm_read_imm_16(uVar10);
      }
    }
    if ((char)uVar3 < '\0') {
      local_48 = local_48 & 0xff00;
    }
    else {
      sprintf((char *)&local_48,"A%d",(ulong)(instruction & 7));
    }
    local_38 = uVar13;
    if ((uVar3 & 0x40) == 0) {
      uVar11 = 0x6c;
      if ((uVar3 >> 0xb & 1) == 0) {
        uVar11 = 0x77;
      }
      sprintf(local_44,"%c%d.%c",(ulong)((uint)(uVar3 < 0x8000) * 3 + 0x41),
              (ulong)(uVar3 >> 0xc & 7),uVar11);
      uVar10 = uVar3 >> 9 & 3;
      if (uVar10 != 0) {
        sVar4 = strlen(local_44);
        sprintf(local_44 + sVar4,"*%d",(ulong)(uint)(1 << (sbyte)uVar10));
      }
    }
    else {
      local_44[0] = '\0';
    }
    pcVar6 = get_ea_mode_str::mode;
    uVar3 = uVar3 & 7;
    pcVar6[0] = '(';
    pcVar6[1] = '\0';
    if (4 < uVar3 || uVar3 - 1 < 3) {
      sVar4 = strlen(pcVar6);
      (pcVar6 + sVar4)[0] = '[';
      (pcVar6 + sVar4)[1] = '\0';
    }
    if (uVar8 == 0) {
      if ((char)local_48 != '\0') goto LAB_0040127d;
      bVar2 = false;
      bVar1 = true;
    }
    else {
      if (uVar7 == 0x30) {
        make_signed_hex_str_32(uVar8);
        pcVar9 = make_signed_hex_str_32::str;
      }
      else {
        make_signed_hex_str_16(uVar8);
        pcVar9 = make_signed_hex_str_16::str;
      }
      strcat(pcVar6,pcVar9);
      pcVar6 = get_ea_mode_str::mode;
      if ((char)local_48 != '\0') {
        sVar4 = strlen(get_ea_mode_str::mode);
        (pcVar6 + sVar4)[0] = ',';
        (pcVar6 + sVar4)[1] = '\0';
LAB_0040127d:
        strcat(pcVar6,(char *)&local_48);
      }
      bVar2 = true;
      bVar1 = false;
    }
    pcVar6 = get_ea_mode_str::mode;
    if (uVar3 < 5) {
      if (local_44[0] != '\0') {
        if (!bVar1) goto LAB_004012c6;
        goto LAB_004012d4;
      }
LAB_004012e6:
      pcVar6 = get_ea_mode_str::mode;
      if (uVar3 - 1 < 3) {
        sVar4 = strlen(get_ea_mode_str::mode);
        (pcVar6 + sVar4)[0] = ']';
        (pcVar6 + sVar4)[1] = '\0';
        goto LAB_00401301;
      }
    }
    else {
      sVar4 = strlen(get_ea_mode_str::mode);
      (pcVar6 + sVar4)[0] = ']';
      (pcVar6 + sVar4)[1] = '\0';
      if (local_44[0] != '\0') {
LAB_004012c6:
        sVar4 = strlen(pcVar6);
        (pcVar6 + sVar4)[0] = ',';
        (pcVar6 + sVar4)[1] = '\0';
LAB_004012d4:
        strcat(pcVar6,local_44);
        bVar2 = true;
        goto LAB_004012e6;
      }
LAB_00401301:
      bVar2 = true;
    }
    uVar3 = local_38;
    pcVar6 = get_ea_mode_str::mode;
    if (local_38 == 0) goto LAB_00401365;
    uVar10 = local_3c;
    if (bVar2) {
      sVar4 = strlen(get_ea_mode_str::mode);
      (pcVar6 + sVar4)[0] = ',';
      (pcVar6 + sVar4)[1] = '\0';
      uVar10 = local_3c;
    }
    goto LAB_00401333;
  case 0x38:
    uVar3 = dasm_read_imm_16(instruction);
    pcVar9 = "$%x.w";
    goto LAB_0040108b;
  case 0x39:
    uVar3 = dasm_read_imm_32(instruction);
    pcVar9 = "$%x.l";
LAB_0040108b:
    uVar12 = (ulong)uVar3;
    goto LAB_00400e3f;
  case 0x3a:
    uVar3 = dasm_read_imm_16(instruction);
    pcVar6 = get_ea_mode_str::mode;
    make_signed_hex_str_16(uVar3);
    sprintf(pcVar6,"(%s,PC)",make_signed_hex_str_16::str);
    uVar12 = (ulong)((g_cpu_pc + (uint)(uVar3 < 0x8000) * 0x10000 + uVar3) - 0x10002);
    pcVar6 = g_helper_str;
    pcVar9 = "; ($%x)";
    goto LAB_00400e3f;
  case 0x3b:
    uVar3 = dasm_read_imm_16(instruction);
    pcVar6 = get_ea_mode_str::mode;
    cVar14 = (char)uVar3;
    if ((uVar3 >> 8 & 1) == 0) {
      if (cVar14 != '\0') {
        make_signed_hex_str_8(uVar3);
        uVar5 = (uint)(uVar3 < 0x8000) * 3 + 0x41;
        uVar10 = uVar3 >> 0xc & 7;
        uVar12 = 0x6c;
        if ((uVar3 >> 0xb & 1) == 0) {
          uVar12 = 0x77;
        }
        pcVar9 = "(%s,PC,%c%d.%c";
        goto LAB_00400ef6;
      }
      uVar11 = 0x6c;
      if ((uVar3 >> 0xb & 1) == 0) {
        uVar11 = 0x77;
      }
      sprintf(get_ea_mode_str::mode,"(PC,%c%d.%c",(ulong)((uint)(uVar3 < 0x8000) * 3 + 0x41),
              (ulong)(uVar3 >> 0xc & 7),uVar11);
      goto LAB_00400fa8;
    }
    if ((uVar3 & 0xe4) == 0xc4 || (uVar3 & 0xe2) == 0xc0) goto LAB_00400f26;
    uVar8 = uVar3 & 0x30;
    uVar10 = 0;
    uVar5 = 0;
    if (0x10 < uVar8) {
      if (uVar8 == 0x30) {
        uVar5 = dasm_read_imm_32(instruction);
      }
      else {
        uVar5 = dasm_read_imm_16(instruction);
      }
    }
    uVar13 = uVar3 & 3;
    local_34 = uVar3 & 0x44;
    if (local_34 != 0x44 && 1 < uVar13) {
      if (uVar13 == 3) {
        uVar10 = dasm_read_imm_32(instruction);
      }
      else {
        uVar10 = dasm_read_imm_16(instruction);
      }
    }
    if (cVar14 < '\0') {
      local_48 = (ushort)local_48._1_1_ << 8;
    }
    else {
      local_46 = 0;
      local_48 = 0x4350;
    }
    local_3c = uVar13;
    local_38 = uVar10;
    if ((uVar3 & 0x40) == 0) {
      uVar11 = 0x6c;
      if ((uVar3 >> 0xb & 1) == 0) {
        uVar11 = 0x77;
      }
      sprintf(local_44,"%c%d.%c",(ulong)((uint)(uVar3 < 0x8000) * 3 + 0x41),
              (ulong)(uVar3 >> 0xc & 7),uVar11);
      uVar10 = uVar3 >> 9 & 3;
      if (uVar10 != 0) {
        sVar4 = strlen(local_44);
        sprintf(local_44 + sVar4,"*%d",(ulong)(uint)(1 << (sbyte)uVar10));
      }
    }
    else {
      local_44[0] = '\0';
    }
    pcVar6 = get_ea_mode_str::mode;
    uVar3 = uVar3 & 7;
    pcVar6[0] = '(';
    pcVar6[1] = '\0';
    if (4 < uVar3 || uVar3 - 1 < 3) {
      sVar4 = strlen(pcVar6);
      (pcVar6 + sVar4)[0] = '[';
      (pcVar6 + sVar4)[1] = '\0';
    }
    if (uVar5 == 0) {
      if (-1 < cVar14) goto LAB_00401575;
      bVar2 = false;
      bVar1 = true;
    }
    else {
      if (uVar8 == 0x30) {
        make_signed_hex_str_32(uVar5);
        pcVar9 = make_signed_hex_str_32::str;
      }
      else {
        make_signed_hex_str_16(uVar5);
        pcVar9 = make_signed_hex_str_16::str;
      }
      strcat(pcVar6,pcVar9);
      pcVar6 = get_ea_mode_str::mode;
      if (cVar14 < '\0') {
        bVar1 = false;
        bVar2 = true;
      }
      else {
        sVar4 = strlen(get_ea_mode_str::mode);
        (pcVar6 + sVar4)[0] = ',';
        (pcVar6 + sVar4)[1] = '\0';
LAB_00401575:
        strcat(pcVar6,(char *)&local_48);
        bVar2 = true;
        bVar1 = false;
      }
    }
    pcVar6 = get_ea_mode_str::mode;
    if (uVar3 < 5) {
      if (local_44[0] != '\0') {
        if (!bVar1) goto LAB_004015c7;
        goto LAB_004015d5;
      }
LAB_004015e7:
      pcVar6 = get_ea_mode_str::mode;
      if (uVar3 - 1 < 3) {
        sVar4 = strlen(get_ea_mode_str::mode);
        (pcVar6 + sVar4)[0] = ']';
        (pcVar6 + sVar4)[1] = '\0';
        goto LAB_00401602;
      }
    }
    else {
      sVar4 = strlen(get_ea_mode_str::mode);
      (pcVar6 + sVar4)[0] = ']';
      (pcVar6 + sVar4)[1] = '\0';
      if (local_44[0] != '\0') {
LAB_004015c7:
        sVar4 = strlen(pcVar6);
        (pcVar6 + sVar4)[0] = ',';
        (pcVar6 + sVar4)[1] = '\0';
LAB_004015d5:
        strcat(pcVar6,local_44);
        bVar2 = true;
        goto LAB_004015e7;
      }
LAB_00401602:
      bVar2 = true;
    }
    uVar3 = local_38;
    uVar5 = local_3c;
    pcVar6 = get_ea_mode_str::mode;
    if (local_38 == 0) goto LAB_00401365;
    uVar10 = local_34;
    if (bVar2) {
      sVar4 = strlen(get_ea_mode_str::mode);
      (pcVar6 + sVar4)[0] = ',';
      (pcVar6 + sVar4)[1] = '\0';
      uVar10 = local_34;
    }
LAB_00401333:
    pcVar6 = get_ea_mode_str::mode;
    if (uVar5 == 3 && uVar10 != 0x44) {
      make_signed_hex_str_32(uVar3);
      pcVar9 = make_signed_hex_str_32::str;
    }
    else {
      make_signed_hex_str_16(uVar3);
      pcVar9 = make_signed_hex_str_16::str;
    }
    strcat(pcVar6,pcVar9);
LAB_00401365:
    pcVar6 = get_ea_mode_str::mode;
    sVar4 = strlen(get_ea_mode_str::mode);
    (pcVar6 + sVar4)[0] = ')';
    (pcVar6 + sVar4)[1] = '\0';
    return get_ea_mode_str::mode;
  case 0x3c:
    get_imm_str_u(size);
    strcpy(pcVar6,get_imm_str_u::str);
    return get_ea_mode_str::mode;
  default:
    pcVar9 = "INVALID $%x";
    goto LAB_00400e3f;
  }
  uVar12 = (ulong)(instruction & 7);
LAB_00400e3f:
  sprintf(pcVar6,pcVar9,uVar12);
  return get_ea_mode_str::mode;
}

Assistant:

static char* get_ea_mode_str(uint instruction, uint size)
{
	static char b1[64];
	static char b2[64];
	static char* mode = b2;
	uint extension;
	uint base;
	uint outer;
	char base_reg[4];
	char index_reg[8];
	uint preindex;
	uint postindex;
	uint comma = 0;
	uint temp_value;

	/* Switch buffers so we don't clobber on a double-call to this function */
	mode = mode == b1 ? b2 : b1;

	switch(instruction & 0x3f)
	{
		case 0x00: case 0x01: case 0x02: case 0x03: case 0x04: case 0x05: case 0x06: case 0x07:
		/* data register direct */
			sprintf(mode, "D%d", instruction&7);
			break;
		case 0x08: case 0x09: case 0x0a: case 0x0b: case 0x0c: case 0x0d: case 0x0e: case 0x0f:
		/* address register direct */
			sprintf(mode, "A%d", instruction&7);
			break;
		case 0x10: case 0x11: case 0x12: case 0x13: case 0x14: case 0x15: case 0x16: case 0x17:
		/* address register indirect */
			sprintf(mode, "(A%d)", instruction&7);
			break;
		case 0x18: case 0x19: case 0x1a: case 0x1b: case 0x1c: case 0x1d: case 0x1e: case 0x1f:
		/* address register indirect with postincrement */
			sprintf(mode, "(A%d)+", instruction&7);
			break;
		case 0x20: case 0x21: case 0x22: case 0x23: case 0x24: case 0x25: case 0x26: case 0x27:
		/* address register indirect with predecrement */
			sprintf(mode, "-(A%d)", instruction&7);
			break;
		case 0x28: case 0x29: case 0x2a: case 0x2b: case 0x2c: case 0x2d: case 0x2e: case 0x2f:
		/* address register indirect with displacement*/
			sprintf(mode, "(%s,A%d)", make_signed_hex_str_16(read_imm_16()), instruction&7);
			break;
		case 0x30: case 0x31: case 0x32: case 0x33: case 0x34: case 0x35: case 0x36: case 0x37:
		/* address register indirect with index */
			extension = read_imm_16();

			if(EXT_FULL(extension))
			{
				if(EXT_EFFECTIVE_ZERO(extension))
				{
					strcpy(mode, "0");
					break;
				}
				base = EXT_BASE_DISPLACEMENT_PRESENT(extension) ? (EXT_BASE_DISPLACEMENT_LONG(extension) ? read_imm_32() : read_imm_16()) : 0;
				outer = EXT_OUTER_DISPLACEMENT_PRESENT(extension) ? (EXT_OUTER_DISPLACEMENT_LONG(extension) ? read_imm_32() : read_imm_16()) : 0;
				if(EXT_BASE_REGISTER_PRESENT(extension))
					sprintf(base_reg, "A%d", instruction&7);
				else
					*base_reg = 0;
				if(EXT_INDEX_REGISTER_PRESENT(extension))
				{
					sprintf(index_reg, "%c%d.%c", EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
					if(EXT_INDEX_SCALE(extension))
						sprintf(index_reg+strlen(index_reg), "*%d", 1 << EXT_INDEX_SCALE(extension));
				}
				else
					*index_reg = 0;
				preindex = (extension&7) > 0 && (extension&7) < 4;
				postindex = (extension&7) > 4;

				strcpy(mode, "(");
				if(preindex || postindex)
					strcat(mode, "[");
				if(base)
				{
					if (EXT_BASE_DISPLACEMENT_LONG(extension))
					{
						strcat(mode, make_signed_hex_str_32(base));
					}
					else
					{
						strcat(mode, make_signed_hex_str_16(base));
					}
					comma = 1;
				}
				if(*base_reg)
				{
					if(comma)
						strcat(mode, ",");
					strcat(mode, base_reg);
					comma = 1;
				}
				if(postindex)
				{
					strcat(mode, "]");
					comma = 1;
				}
				if(*index_reg)
				{
					if(comma)
						strcat(mode, ",");
					strcat(mode, index_reg);
					comma = 1;
				}
				if(preindex)
				{
					strcat(mode, "]");
					comma = 1;
				}
				if(outer)
				{
					if(comma)
						strcat(mode, ",");
                    if (EXT_OUTER_DISPLACEMENT_LONG(extension)) {
                        strcat(mode, make_signed_hex_str_32(outer));
                    } else {
                        strcat(mode, make_signed_hex_str_16(outer));
                    }
				}
				strcat(mode, ")");
				break;
			}

			if(EXT_8BIT_DISPLACEMENT(extension) == 0)
				sprintf(mode, "(A%d,%c%d.%c", instruction&7, EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
			else
				sprintf(mode, "(%s,A%d,%c%d.%c", make_signed_hex_str_8(extension), instruction&7, EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
			if(EXT_INDEX_SCALE(extension))
				sprintf(mode+strlen(mode), "*%d", 1 << EXT_INDEX_SCALE(extension));
			strcat(mode, ")");
			break;
		case 0x38:
		/* absolute short address */
			sprintf(mode, "$%x.w", read_imm_16());
			break;
		case 0x39:
		/* absolute long address */
			sprintf(mode, "$%x.l", read_imm_32());
			break;
		case 0x3a:
		/* program counter with displacement */
			temp_value = read_imm_16();
			sprintf(mode, "(%s,PC)", make_signed_hex_str_16(temp_value));
			sprintf(g_helper_str, "; ($%x)", (make_int_16(temp_value) + g_cpu_pc-2) & 0xffffffff);
			break;
		case 0x3b:
		/* program counter with index */
			extension = read_imm_16();

			if(EXT_FULL(extension))
			{
				if(EXT_EFFECTIVE_ZERO(extension))
				{
					strcpy(mode, "0");
					break;
				}
				base = EXT_BASE_DISPLACEMENT_PRESENT(extension) ? (EXT_BASE_DISPLACEMENT_LONG(extension) ? read_imm_32() : read_imm_16()) : 0;
				outer = EXT_OUTER_DISPLACEMENT_PRESENT(extension) ? (EXT_OUTER_DISPLACEMENT_LONG(extension) ? read_imm_32() : read_imm_16()) : 0;
				if(EXT_BASE_REGISTER_PRESENT(extension))
					strcpy(base_reg, "PC");
				else
					*base_reg = 0;
				if(EXT_INDEX_REGISTER_PRESENT(extension))
				{
					sprintf(index_reg, "%c%d.%c", EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
					if(EXT_INDEX_SCALE(extension))
						sprintf(index_reg+strlen(index_reg), "*%d", 1 << EXT_INDEX_SCALE(extension));
				}
				else
					*index_reg = 0;
				preindex = (extension&7) > 0 && (extension&7) < 4;
				postindex = (extension&7) > 4;

				strcpy(mode, "(");
				if(preindex || postindex)
					strcat(mode, "[");
                if(base)
                {
                    if (EXT_BASE_DISPLACEMENT_LONG(extension))
                    {
                        strcat(mode, make_signed_hex_str_32(base));
                    }
                    else
                    {
                        strcat(mode, make_signed_hex_str_16(base));
                    }
					comma = 1;
				}
				if(*base_reg)
				{
					if(comma)
						strcat(mode, ",");
					strcat(mode, base_reg);
					comma = 1;
				}
				if(postindex)
				{
					strcat(mode, "]");
					comma = 1;
				}
				if(*index_reg)
				{
					if(comma)
						strcat(mode, ",");
					strcat(mode, index_reg);
					comma = 1;
				}
				if(preindex)
				{
					strcat(mode, "]");
					comma = 1;
				}
				if(outer)
				{
					if(comma)
						strcat(mode, ",");
                    if (EXT_OUTER_DISPLACEMENT_LONG(extension)) {
                        strcat(mode, make_signed_hex_str_32(outer));
                    } else {
                        strcat(mode, make_signed_hex_str_16(outer));
                    }
				}
				strcat(mode, ")");
				break;
			}

			if(EXT_8BIT_DISPLACEMENT(extension) == 0)
				sprintf(mode, "(PC,%c%d.%c", EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
			else
				sprintf(mode, "(%s,PC,%c%d.%c", make_signed_hex_str_8(extension), EXT_INDEX_AR(extension) ? 'A' : 'D', EXT_INDEX_REGISTER(extension), EXT_INDEX_LONG(extension) ? 'l' : 'w');
			if(EXT_INDEX_SCALE(extension))
				sprintf(mode+strlen(mode), "*%d", 1 << EXT_INDEX_SCALE(extension));
			strcat(mode, ")");
			break;
		case 0x3c:
		/* Immediate */
			sprintf(mode, "%s", get_imm_str_u(size));
			break;
		default:
			sprintf(mode, "INVALID $%x", instruction & 0x3f);
	}
	return mode;
}